

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

void pbrt::PiecewiseConstant2D::TestCompareDistributions
               (PiecewiseConstant2D *da,PiecewiseConstant2D *db,Float eps)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Float local_2c;
  
  local_2c = eps;
  PiecewiseConstant1D::TestCompareDistributions(&da->pMarginal,&db->pMarginal,eps);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (da->pConditionalY).nStored;
  local_48.data_ = (AssertHelperData *)(db->pConditionalY).nStored;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_40,"da.pConditionalY.size()","db.pConditionalY.size()",(unsigned_long *)&local_50
             ,(unsigned_long *)&local_48);
  iVar1 = local_40[0];
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar1 != (internal)0x0) {
    testing::internal::CmpHelperEQ<pbrt::Bounds2<float>,pbrt::Bounds2<float>>
              (local_40,"da.domain","db.domain",&da->domain,&db->domain);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
                 ,0x23b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((local_40[0] != (internal)0x0) && ((da->pConditionalY).nStored != 0)) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        PiecewiseConstant1D::TestCompareDistributions
                  ((PiecewiseConstant1D *)
                   ((long)&(((da->pConditionalY).ptr)->func).alloc.memoryResource + lVar5),
                   (PiecewiseConstant1D *)
                   ((long)&(((db->pConditionalY).ptr)->func).alloc.memoryResource + lVar5),local_2c)
        ;
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x50;
      } while (uVar4 < (da->pConditionalY).nStored);
    }
  }
  return;
}

Assistant:

void PiecewiseConstant2D::TestCompareDistributions(const PiecewiseConstant2D &da,
                                                   const PiecewiseConstant2D &db,
                                                   Float eps) {
    PiecewiseConstant1D::TestCompareDistributions(da.pMarginal, db.pMarginal, eps);

    ASSERT_EQ(da.pConditionalY.size(), db.pConditionalY.size());
    ASSERT_EQ(da.domain, db.domain);
    for (size_t i = 0; i < da.pConditionalY.size(); ++i)
        PiecewiseConstant1D::TestCompareDistributions(da.pConditionalY[i],
                                                      db.pConditionalY[i], eps);
}